

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_list.c
# Opt level: O0

int main(void)

{
  list_test_item *plVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  UpnpListIter list_iter;
  list_test_item *item_2;
  UpnpListIter list_iter_2;
  int i_2;
  list_test_item *item_1;
  UpnpListIter list_iter_1;
  int i_1;
  list_test_item *item;
  UpnpListHead list;
  int i;
  
  list.prev._4_4_ = 0;
  UpnpListInit(&item);
  for (list.prev._0_4_ = 0; (int)list.prev < 10; list.prev._0_4_ = (int)list.prev + 1) {
    plVar1 = list_test_item__new((int)list.prev);
    uVar2 = UpnpListEnd(&item);
    UpnpListInsert(&item,uVar2,plVar1);
  }
  list_iter_1._4_4_ = 0;
  item_1 = (list_test_item *)UpnpListBegin(&item);
  while( true ) {
    plVar1 = (list_test_item *)UpnpListEnd(&item);
    if (item_1 == plVar1) break;
    printf("List item index: %i, expected: %i\n",(ulong)(uint)item_1->index,(ulong)list_iter_1._4_4_
          );
    if (item_1->index != list_iter_1._4_4_) {
      __assert_fail("item->index == i","upnp/test/test_list.c",0x33,"int main(void)");
    }
    list_iter_1._4_4_ = list_iter_1._4_4_ + 1;
    item_1 = (list_test_item *)UpnpListNext(&item,item_1);
  }
  lVar3 = UpnpListBegin(&item);
  lVar4 = UpnpListEnd(&item);
  if (lVar3 == lVar4) {
    __assert_fail("UpnpListBegin(&list) != UpnpListEnd(&list)","upnp/test/test_list.c",0x3b,
                  "int main(void)");
  }
  list_iter_2._4_4_ = 0;
  item_2 = (list_test_item *)UpnpListBegin(&item);
  while( true ) {
    plVar1 = (list_test_item *)UpnpListEnd(&item);
    if (item_2 == plVar1) break;
    printf("List item index: %i, expected: %i\n",(ulong)(uint)item_2->index,(ulong)list_iter_2._4_4_
          );
    if (item_2->index != list_iter_2._4_4_) {
      __assert_fail("item->index == i","upnp/test/test_list.c",0x48,"int main(void)");
    }
    list_iter_2._4_4_ = list_iter_2._4_4_ + 1;
    plVar1 = (list_test_item *)UpnpListErase(&item,item_2);
    free(item_2);
    item_2 = plVar1;
  }
  lVar3 = UpnpListBegin(&item);
  lVar4 = UpnpListEnd(&item);
  if (lVar3 != lVar4) {
    __assert_fail("UpnpListBegin(&list) == UpnpListEnd(&list)","upnp/test/test_list.c",0x51,
                  "int main(void)");
  }
  lVar3 = UpnpListBegin(&item);
  lVar4 = UpnpListNext(&item,lVar3);
  lVar5 = UpnpListEnd(&item);
  if (lVar4 == lVar5) {
    lVar4 = UpnpListEnd(&item);
    if (lVar3 == lVar4) {
      return 0;
    }
    __assert_fail("list_iter == UpnpListEnd(&list)","upnp/test/test_list.c",0x55,"int main(void)");
  }
  __assert_fail("UpnpListNext(&list, list_iter) == UpnpListEnd(&list)","upnp/test/test_list.c",0x54,
                "int main(void)");
}

Assistant:

int main(void)
{
	int i;
	UpnpListHead list;
	UpnpListInit(&list);

	/* Fill list with items */
	for (i = 0; i < 10; i++) {
		struct list_test_item *item = list_test_item__new(i);

		UpnpListInsert(&list, UpnpListEnd(&list), &item->list);
	}

	/* Verify list contents */
	{
		int i = 0;
		UpnpListIter list_iter = UpnpListBegin(&list);
		while (list_iter != UpnpListEnd(&list)) {
			struct list_test_item *item =
				(struct list_test_item *)list_iter;

			printf("List item index: %i, expected: %i\n",
				item->index,
				i);
			assert(item->index == i);

			i++;
			list_iter = UpnpListNext(&list, list_iter);
		}
	}

	/* Verify list is still fine */
	assert(UpnpListBegin(&list) != UpnpListEnd(&list));

	/* Clear list */
	{
		int i = 0;
		UpnpListIter list_iter = UpnpListBegin(&list);
		while (list_iter != UpnpListEnd(&list)) {
			struct list_test_item *item =
				(struct list_test_item *)list_iter;

			printf("List item index: %i, expected: %i\n",
				item->index,
				i);
			assert(item->index == i);

			i++;
			list_iter = UpnpListErase(&list, list_iter);
			free(item);
		}
	}

	/* Verify list is cleared */
	assert(UpnpListBegin(&list) == UpnpListEnd(&list));

	UpnpListIter list_iter = UpnpListBegin(&list);
	assert(UpnpListNext(&list, list_iter) == UpnpListEnd(&list));
	assert(list_iter == UpnpListEnd(&list));

	return 0;
}